

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::Descriptor::ExtensionRange::CopyTo
          (ExtensionRange *this,DescriptorProto_ExtensionRange *proto)

{
  uint uVar1;
  FeatureSet *from;
  ExtensionRangeOptions *this_00;
  ExtensionRangeOptions *pEVar2;
  FeatureSet *this_01;
  
  (proto->field_0)._impl_.start_ = this->start_;
  uVar1 = *(uint *)&proto->field_0;
  (proto->field_0)._impl_._has_bits_.has_bits_[0] = uVar1 | 2;
  (proto->field_0)._impl_.end_ = this->end_;
  (proto->field_0)._impl_._has_bits_.has_bits_[0] = uVar1 | 6;
  pEVar2 = this->options_;
  if (pEVar2 != (ExtensionRangeOptions *)_ExtensionRangeOptions_default_instance_) {
    this_00 = DescriptorProto_ExtensionRange::mutable_options(proto);
    ExtensionRangeOptions::CopyFrom(this_00,pEVar2);
  }
  from = this->proto_features_;
  if (from != (FeatureSet *)_FeatureSet_default_instance_) {
    pEVar2 = DescriptorProto_ExtensionRange::mutable_options(proto);
    this_01 = ExtensionRangeOptions::mutable_features(pEVar2);
    FeatureSet::CopyFrom(this_01,from);
    return;
  }
  return;
}

Assistant:

void Descriptor::ExtensionRange::CopyTo(
    DescriptorProto_ExtensionRange* proto) const {
  proto->set_start(start_);
  proto->set_end(end_);
  if (options_ != &ExtensionRangeOptions::default_instance()) {
    *proto->mutable_options() = *options_;
  }
  RestoreFeaturesToOptions(proto_features_, proto);
}